

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  int iVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  pointer pnVar5;
  pointer pIVar6;
  int *piVar7;
  IdxElement *keys;
  type_conflict5 tVar8;
  uint uVar9;
  DataKey DVar10;
  long lVar11;
  long lVar12;
  pointer pnVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  devexpr *pdVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  ulong uVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  value_type local_2b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  devexpr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  local_338.m_backend.fpclass = cpp_dec_float_finite;
  local_338.m_backend.prec_elem = 0x1c;
  local_338.m_backend.data._M_elems[0] = 0;
  local_338.m_backend.data._M_elems[1] = 0;
  local_338.m_backend.data._M_elems[2] = 0;
  local_338.m_backend.data._M_elems[3] = 0;
  local_338.m_backend.data._M_elems[4] = 0;
  local_338.m_backend.data._M_elems[5] = 0;
  local_338.m_backend.data._M_elems[6] = 0;
  local_338.m_backend.data._M_elems[7] = 0;
  local_338.m_backend.data._M_elems[8] = 0;
  local_338.m_backend.data._M_elems[9] = 0;
  local_338.m_backend.data._M_elems[10] = 0;
  local_338.m_backend.data._M_elems[0xb] = 0;
  local_338.m_backend.data._M_elems[0xc] = 0;
  local_338.m_backend.data._M_elems[0xd] = 0;
  local_338.m_backend.data._M_elems[0xe] = 0;
  local_338.m_backend.data._M_elems[0xf] = 0;
  local_338.m_backend.data._M_elems[0x10] = 0;
  local_338.m_backend.data._M_elems[0x11] = 0;
  local_338.m_backend.data._M_elems[0x12] = 0;
  local_338.m_backend.data._M_elems[0x13] = 0;
  local_338.m_backend.data._M_elems[0x14] = 0;
  local_338.m_backend.data._M_elems[0x15] = 0;
  local_338.m_backend.data._M_elems[0x16] = 0;
  local_338.m_backend.data._M_elems[0x17] = 0;
  local_338.m_backend.data._M_elems[0x18] = 0;
  local_338.m_backend.data._M_elems[0x19] = 0;
  local_338.m_backend.data._M_elems._104_5_ = 0;
  local_338.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_338.m_backend.exp = 0;
  local_338.m_backend.neg = false;
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = (pSVar3->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2b4.val.m_backend.fpclass = cpp_dec_float_finite;
  local_2b4.val.m_backend.prec_elem = 0x1c;
  local_2b4.val.m_backend.data._M_elems[0] = 0;
  local_2b4.val.m_backend.data._M_elems[1] = 0;
  local_2b4.val.m_backend.data._M_elems[2] = 0;
  local_2b4.val.m_backend.data._M_elems[3] = 0;
  local_2b4.val.m_backend.data._M_elems[4] = 0;
  local_2b4.val.m_backend.data._M_elems[5] = 0;
  local_2b4.val.m_backend.data._M_elems[6] = 0;
  local_2b4.val.m_backend.data._M_elems[7] = 0;
  local_2b4.val.m_backend.data._M_elems[8] = 0;
  local_2b4.val.m_backend.data._M_elems[9] = 0;
  local_2b4.val.m_backend.data._M_elems[10] = 0;
  local_2b4.val.m_backend.data._M_elems[0xb] = 0;
  local_2b4.val.m_backend.data._M_elems[0xc] = 0;
  local_2b4.val.m_backend.data._M_elems[0xd] = 0;
  local_2b4.val.m_backend.data._M_elems[0xe] = 0;
  local_2b4.val.m_backend.data._M_elems[0xf] = 0;
  local_2b4.val.m_backend.data._M_elems[0x10] = 0;
  local_2b4.val.m_backend.data._M_elems[0x11] = 0;
  local_2b4.val.m_backend.data._M_elems[0x12] = 0;
  local_2b4.val.m_backend.data._M_elems[0x13] = 0;
  local_2b4.val.m_backend.data._M_elems[0x18] = 0;
  local_2b4.val.m_backend.data._M_elems[0x19] = 0;
  local_2b4.val.m_backend.data._M_elems._104_5_ = 0;
  local_2b4.val.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_2b4.val.m_backend.exp = 0;
  local_2b4.val.m_backend.neg = false;
  local_2b4.val.m_backend.data._M_elems[0x14] = 0;
  local_2b4.val.m_backend.data._M_elems[0x15] = 0;
  local_2b4.val.m_backend.data._M_elems[0x16] = 0;
  local_2b4.val.m_backend.data._M_elems[0x17] = 0;
  pIVar6 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar6) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar6;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  uVar17 = (ulong)(uint)(pSVar3->infeasibilities).super_IdxSet.num;
  while( true ) {
    if ((int)uVar17 < 1) break;
    iVar1 = (((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->infeasibilities).super_IdxSet.idx[uVar17 - 1];
    lVar12 = 0x1c;
    pnVar13 = pnVar4 + iVar1;
    pnVar14 = &local_338;
    for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
      pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    local_338.m_backend.exp = pnVar4[iVar1].m_backend.exp;
    local_338.m_backend.neg = pnVar4[iVar1].m_backend.neg;
    local_338.m_backend.fpclass = pnVar4[iVar1].m_backend.fpclass;
    local_338.m_backend.prec_elem = pnVar4[iVar1].m_backend.prec_elem;
    pnVar14 = feastol;
    pnVar16 = &result;
    for (; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
    }
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar8 = boost::multiprecision::operator<(&local_338,&result);
    pSVar3 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    if (tVar8) {
      (pSVar3->isInfeasible).data[iVar1] = 1;
      local_2b4.idx = iVar1;
      lVar12 = 0x1c;
      pnVar14 = &local_338;
      pdVar15 = local_b0;
      for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
        *(uint *)pdVar15 = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pdVar15 = pdVar15 + (ulong)bVar18 * -8 + 4;
      }
      local_40 = local_338.m_backend.exp;
      local_3c = local_338.m_backend.neg;
      local_38 = local_338.m_backend.fpclass;
      iStack_34 = local_338.m_backend.prec_elem;
      pnVar13 = pnVar5 + iVar1;
      pnVar14 = &local_130;
      for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (pointer)((long)pnVar13 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_130.m_backend.exp = pnVar5[iVar1].m_backend.exp;
      local_130.m_backend.neg = pnVar5[iVar1].m_backend.neg;
      local_130.m_backend.fpclass = pnVar5[iVar1].m_backend.fpclass;
      local_130.m_backend.prec_elem = pnVar5[iVar1].m_backend.prec_elem;
      pnVar14 = feastol;
      pnVar16 = &local_1b0;
      for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (feastol->m_backend).exp;
      local_1b0.m_backend.neg = (feastol->m_backend).neg;
      local_1b0.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_1b0.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_b0,&local_130,&local_1b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_b0);
      pnVar14 = &result;
      pnVar16 = &local_2b4.val;
      for (; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_2b4.val.m_backend.exp = result.m_backend.exp;
      local_2b4.val.m_backend.neg = result.m_backend.neg;
      local_2b4.val.m_backend.fpclass = result.m_backend.fpclass;
      local_2b4.val.m_backend.prec_elem = result.m_backend.prec_elem;
      std::
      vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ::push_back(&(this->prices).data,&local_2b4);
    }
    else {
      piVar7 = (pSVar3->infeasibilities).super_IdxSet.idx;
      iVar2 = (pSVar3->infeasibilities).super_IdxSet.num;
      (pSVar3->infeasibilities).super_IdxSet.num = iVar2 + -1;
      piVar7[uVar17 - 1] = piVar7[(long)iVar2 + -1];
      (pSVar3->isInfeasible).data[iVar1] = 0;
    }
    uVar17 = uVar17 - 1;
  }
  keys = (this->prices).data.
         super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar6 = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  lVar12 = 0;
  uVar9 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                    (keys,&(this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).compare,0,(int)(((long)pIVar6 - (long)keys) / 0x84),100,0,0,true);
  uVar17 = 0;
  if (0 < (int)uVar9) {
    uVar17 = (ulong)uVar9;
  }
  for (; uVar17 * 0x84 - lVar12 != 0; lVar12 = lVar12 + 0x84) {
    DIdxSet::addIdx(&this->bestPrices,
                    *(int *)((long)&(((this->prices).data.
                                      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->val).m_backend +
                            lVar12 + -4));
    (((this->
      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).thesolver)->isInfeasible).data
    [*(int *)((long)&(((this->prices).data.
                       super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                       ._M_impl.super__Vector_impl_data._M_start)->val).m_backend + lVar12 + -4)] =
         2;
  }
  if ((int)uVar9 < 1) {
    DVar10.info = 0;
    DVar10.idx = -1;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&best->m_backend,
               &(((this->prices).data.
                  super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                  ._M_impl.super__Vector_impl_data._M_start)->val).m_backend);
    DVar10 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::coId((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver,
                             ((this->prices).data.
                              super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                              ._M_impl.super__Vector_impl_data._M_start)->idx);
  }
  return (SPxId)DVar10;
}

Assistant:

SPxId SPxDevexPR<R>::buildBestPriceVectorEnterDim(R& best, R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* coTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -feastol)
      {
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(x, cpen[idx], feastol);
         prices.append(price);
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = prices[0].val;
      return this->thesolver->coId(prices[0].idx);
   }
   else
      return SPxId();
}